

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_env_mod.cxx
# Opt level: O1

void __thiscall xray_re::xr_level_env_mod::save(xr_level_env_mod *this,xr_writer *w)

{
  pointer ppeVar1;
  env_mod_data *peVar2;
  uint32_t id;
  pointer ppeVar3;
  bool bVar4;
  float local_3c;
  uint32_t *local_38;
  
  local_38 = &this->m_version;
  bVar4 = this->m_version != 0;
  if (bVar4) {
    xr_writer::w_raw_chunk(w,0,local_38,4,false);
  }
  id = (uint32_t)bVar4;
  ppeVar3 = (this->m_env_mods).
            super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppeVar1 = (this->m_env_mods).
            super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppeVar3 != ppeVar1) {
    do {
      peVar2 = *ppeVar3;
      xr_writer::open_chunk(w,id);
      local_3c = (peVar2->position).field_0.field_0.x;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->position).field_0.field_0.y;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->position).field_0.field_0.z;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = peVar2->radius;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = peVar2->power;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = peVar2->far_plane;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->fog_color).field_0.field_0.x;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->fog_color).field_0.field_0.y;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->fog_color).field_0.field_0.z;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = peVar2->fog_density;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->ambient_color).field_0.field_0.x;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->ambient_color).field_0.field_0.y;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->ambient_color).field_0.field_0.z;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->sky_color).field_0.field_0.x;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->sky_color).field_0.field_0.y;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->sky_color).field_0.field_0.z;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->hemi_color).field_0.field_0.x;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = (peVar2->hemi_color).field_0.field_0.y;
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      local_3c = *(float *)((long)&(peVar2->hemi_color).field_0 + 8);
      (*w->_vptr_xr_writer[2])(w,&local_3c,4);
      if (*local_38 != 0) {
        local_3c = (float)CONCAT22(local_3c._2_2_,peVar2->extra);
        (*w->_vptr_xr_writer[2])(w,&local_3c,2);
      }
      xr_writer::close_chunk(w);
      ppeVar3 = ppeVar3 + 1;
      id = id + 1;
    } while (ppeVar3 != ppeVar1);
  }
  return;
}

Assistant:

void xr_level_env_mod::save(xr_writer& w) const
{
	uint32_t id;
	if (m_version == ENV_MOD_VERSION_0) {
		id = 0;
	} else {
		id = 1;
		w.w_chunk(ENV_MOD_CHUNK_VERSION, m_version);
	}
	for (env_mod_data_vec_cit it = m_env_mods.begin(), end = m_env_mods.end();
			it != end; ++it, ++id) {
		const env_mod_data* em = *it;
		w.open_chunk(id);
		w.w_fvector3(em->position);
		w.w_float(em->radius);
		w.w_float(em->power);
		w.w_float(em->far_plane);
		w.w_fvector3(em->fog_color);
		w.w_float(em->fog_density);
		w.w_fvector3(em->ambient_color);
		w.w_fvector3(em->sky_color);
		w.w_fvector3(em->hemi_color);
		if (m_version != ENV_MOD_VERSION_0)
			w.w_u16(em->extra);
		w.close_chunk();
	}
}